

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall mjs::print_visitor::operator()(print_visitor *this,labelled_statement *s)

{
  wostream *os;
  wstring local_1d0 [32];
  wstring_view local_1b0 [2];
  wostringstream local_190 [8];
  wostringstream _woss;
  labelled_statement *s_local;
  print_visitor *this_local;
  
  std::__cxx11::wostringstream::wostringstream(local_190);
  os = std::operator<<((wostream *)local_190,"Not implemented: ");
  mjs::operator<<(os,(syntax_node *)s);
  std::__cxx11::wostringstream::str();
  local_1b0[0] = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_1d0);
  throw_runtime_error(local_1b0,
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/printer.cpp"
                      ,0xfe);
}

Assistant:

void operator()(const labelled_statement& s) {
        NOT_IMPLEMENTED(s);
    }